

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_agents.c
# Opt level: O0

REF_STATUS
ref_agents_push(REF_AGENTS ref_agents,REF_INT node,REF_INT part,REF_INT seed,REF_DBL *xyz,
               REF_INT *id_ptr)

{
  int local_40;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT id;
  REF_INT i;
  REF_INT *id_ptr_local;
  REF_DBL *xyz_local;
  REF_INT local_20;
  REF_INT seed_local;
  REF_INT part_local;
  REF_INT node_local;
  REF_AGENTS ref_agents_local;
  
  _id = id_ptr;
  id_ptr_local = (REF_INT *)xyz;
  xyz_local._4_4_ = seed;
  local_20 = part;
  seed_local = node;
  _part_local = ref_agents;
  ref_agents_local._4_4_ = ref_agents_new(ref_agents,&local_40);
  if (ref_agents_local._4_4_ == 0) {
    *_id = local_40;
    _part_local->agent[local_40].mode = REF_AGENT_WALKING;
    _part_local->agent[local_40].home = _part_local->ref_mpi->id;
    _part_local->agent[local_40].node = seed_local;
    _part_local->agent[local_40].part = local_20;
    _part_local->agent[local_40].seed = xyz_local._4_4_;
    _part_local->agent[local_40].global = -1;
    _part_local->agent[local_40].step = 0;
    for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < 3;
        ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
      _part_local->agent[local_40].xyz[ref_private_macro_code_rss] =
           *(REF_DBL *)(id_ptr_local + (long)ref_private_macro_code_rss * 2);
    }
    ref_agents_local._4_4_ = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c",0xa7,
           "ref_agents_push",(ulong)ref_agents_local._4_4_,"new");
  }
  return ref_agents_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_agents_push(REF_AGENTS ref_agents, REF_INT node,
                                   REF_INT part, REF_INT seed, REF_DBL *xyz,
                                   REF_INT *id_ptr) {
  REF_INT i, id;

  RSS(ref_agents_new(ref_agents, &id), "new");
  *id_ptr = id;

  ref_agent_mode(ref_agents, id) = REF_AGENT_WALKING;
  ref_agent_home(ref_agents, id) = ref_mpi_rank(ref_agents->ref_mpi);
  ref_agent_node(ref_agents, id) = node;
  ref_agent_part(ref_agents, id) = part;
  ref_agent_seed(ref_agents, id) = seed;
  ref_agent_global(ref_agents, id) = REF_EMPTY;
  ref_agent_step(ref_agents, id) = 0;
  for (i = 0; i < 3; i++) ref_agent_xyz(ref_agents, i, id) = xyz[i];

  return REF_SUCCESS;
}